

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

void Vertical_Sweep_Span(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int local_60;
  Byte f2;
  Byte f1;
  Int c2;
  Int c1;
  Byte *target;
  ulong uStack_48;
  Int dropOutControl;
  Long e2;
  Long e1;
  PProfile_conflict right_local;
  PProfile_conflict left_local;
  FT_F26Dot6 x2_local;
  FT_F26Dot6 x1_local;
  Short y_local;
  black_PWorker worker_local;
  
  uVar3 = (x1 + worker->precision) - 1U & (long)-worker->precision;
  uStack_48 = x2 & -worker->precision;
  if (((((left->flags & 7) != 2) &&
       ((x2 - x1) - (long)worker->precision <= (long)worker->precision_jitter)) && (uVar3 != x1)) &&
     (uStack_48 != x2)) {
    uStack_48 = uVar3;
  }
  e2 = (long)uVar3 >> ((byte)worker->precision_bits & 0x3f);
  uStack_48 = (long)uStack_48 >> ((byte)worker->precision_bits & 0x3f);
  if ((-1 < (long)uStack_48) && (e2 < (long)(ulong)worker->bWidth)) {
    if (e2 < 0) {
      e2 = 0;
    }
    if ((long)(ulong)worker->bWidth <= (long)uStack_48) {
      uStack_48 = (ulong)(int)(worker->bWidth - 1);
    }
    local_60 = (int)(short)(e2 >> 3);
    bVar1 = (byte)(0xff >> ((byte)e2 & 7));
    bVar2 = (byte)(0x7f >> ((byte)uStack_48 & 7)) ^ 0xff;
    _c2 = worker->bLine + local_60;
    local_60 = (short)((long)uStack_48 >> 3) - local_60;
    if (local_60 < 1) {
      *_c2 = *_c2 | bVar1 & bVar2;
    }
    else {
      *_c2 = *_c2 | bVar1;
      while (local_60 = local_60 + -1, 0 < local_60) {
        _c2[1] = 0xff;
        _c2 = _c2 + 1;
      }
      _c2[1] = _c2[1] | bVar2;
    }
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Span( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long  e1, e2;

    Int  dropOutControl = left->flags & 7;

    FT_UNUSED( y );
    FT_UNUSED( left );
    FT_UNUSED( right );


    /* in high-precision mode, we need 12 digits after the comma to */
    /* represent multiples of 1/(1<<12) = 1/4096                    */
    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    e1 = CEILING( x1 );
    e2 = FLOOR( x2 );

    /* take care of the special case where both the left */
    /* and right contour lie exactly on pixel centers    */
    if ( dropOutControl != 2                             &&
         x2 - x1 - ras.precision <= ras.precision_jitter &&
         e1 != x1 && e2 != x2                            )
      e2 = e1;

    e1 = TRUNC( e1 );
    e2 = TRUNC( e2 );

    if ( e2 >= 0 && e1 < ras.bWidth )
    {
      Byte*  target;

      Int   c1, c2;
      Byte  f1, f2;


      if ( e1 < 0 )
        e1 = 0;
      if ( e2 >= ras.bWidth )
        e2 = ras.bWidth - 1;

      FT_TRACE7(( " -> x=[%ld;%ld]", e1, e2 ));

      c1 = (Short)( e1 >> 3 );
      c2 = (Short)( e2 >> 3 );

      f1 = (Byte)  ( 0xFF >> ( e1 & 7 ) );
      f2 = (Byte) ~( 0x7F >> ( e2 & 7 ) );

      target = ras.bLine + c1;
      c2 -= c1;

      if ( c2 > 0 )
      {
        target[0] |= f1;

        /* memset() is slower than the following code on many platforms. */
        /* This is due to the fact that, in the vast majority of cases,  */
        /* the span length in bytes is relatively small.                 */
        while ( --c2 > 0 )
          *( ++target ) = 0xFF;

        target[1] |= f2;
      }
      else
        *target |= ( f1 & f2 );
    }

    FT_TRACE7(( "\n" ));
  }